

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

int mbedtls_internal_sha256_process(mbedtls_sha256_context *ctx,uchar *data)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint32_t uVar19;
  uint32_t local_178 [4];
  uint local_168 [12];
  uint auStack_138 [9];
  uint32_t auStack_114 [5];
  uint auStack_100 [2];
  uint32_t auStack_f8 [50];
  
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    local_178[lVar2 + 4] = ctx->state[lVar2];
  }
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    uVar1 = *(uint *)(data + lVar2 * 4);
    local_178[lVar2 + 0x10] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  for (uVar15 = 0; uVar15 < 0x10; uVar15 = uVar15 + 8) {
    iVar7 = ((local_168[4] << 7 | local_168[4] >> 0x19) ^
            (local_168[4] << 0x15 | local_168[4] >> 0xb) ^
            (local_168[4] << 0x1a | local_168[4] >> 6)) + local_168[7] + K[uVar15] +
            local_178[uVar15 + 0x10] + ((local_168[5] ^ local_168[6]) & local_168[4] ^ local_168[6])
    ;
    uVar1 = local_168[3] + iVar7;
    iVar10 = ((local_168[5] ^ local_168[4]) & uVar1 ^ local_168[5]) + local_168[6] + K[uVar15 + 1] +
             ((uVar1 * 0x80 | uVar1 >> 0x19) ^
             (uVar1 * 0x200000 | uVar1 >> 0xb) ^ (uVar1 * 0x4000000 | uVar1 >> 6)) +
             local_178[uVar15 + 0x11];
    uVar13 = ((local_168[1] | local_168[0]) & local_168[2] | local_168[1] & local_168[0]) +
             ((local_168[0] << 10 | local_168[0] >> 0x16) ^
             (local_168[0] << 0x13 | local_168[0] >> 0xd) ^
             (local_168[0] << 0x1e | local_168[0] >> 2)) + iVar7;
    uVar3 = local_168[2] + iVar10;
    uVar8 = ((uVar13 | local_168[0]) & local_168[1] | uVar13 & local_168[0]) +
            ((uVar13 * 0x400 | uVar13 >> 0x16) ^
            (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar10;
    iVar7 = local_168[5] + K[uVar15 + 2] + local_178[uVar15 + 0x12] +
            ((uVar1 ^ local_168[4]) & uVar3 ^ local_168[4]) +
            ((uVar3 * 0x80 | uVar3 >> 0x19) ^
            (uVar3 * 0x200000 | uVar3 >> 0xb) ^ (uVar3 * 0x4000000 | uVar3 >> 6));
    uVar4 = local_168[1] + iVar7;
    uVar11 = ((uVar8 | uVar13) & local_168[0] | uVar8 & uVar13) +
             ((uVar8 * 0x400 | uVar8 >> 0x16) ^
             (uVar8 * 0x80000 | uVar8 >> 0xd) ^ (uVar8 * 0x40000000 | uVar8 >> 2)) + iVar7;
    iVar7 = local_168[4] + K[uVar15 + 3] + local_178[uVar15 + 0x13] +
            ((uVar3 ^ uVar1) & uVar4 ^ uVar1) +
            ((uVar4 * 0x80 | uVar4 >> 0x19) ^
            (uVar4 * 0x200000 | uVar4 >> 0xb) ^ (uVar4 * 0x4000000 | uVar4 >> 6));
    uVar6 = local_168[0] + iVar7;
    uVar5 = ((uVar11 | uVar8) & uVar13 | uVar11 & uVar8) +
            ((uVar11 * 0x400 | uVar11 >> 0x16) ^
            (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar7;
    iVar7 = uVar1 + K[uVar15 + 4] + local_178[uVar15 + 0x14] + ((uVar4 ^ uVar3) & uVar6 ^ uVar3) +
            ((uVar6 * 0x80 | uVar6 >> 0x19) ^
            (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6));
    local_168[7] = uVar13 + iVar7;
    local_168[3] = iVar7 + ((uVar5 | uVar11) & uVar8 | uVar5 & uVar11) +
                           ((uVar5 * 0x400 | uVar5 >> 0x16) ^
                           (uVar5 * 0x80000 | uVar5 >> 0xd) ^ (uVar5 * 0x40000000 | uVar5 >> 2));
    iVar7 = uVar3 + K[uVar15 + 5] + local_178[uVar15 + 0x15] +
            ((uVar6 ^ uVar4) & local_168[7] ^ uVar4) +
            ((local_168[7] * 0x80 | local_168[7] >> 0x19) ^
            (local_168[7] * 0x200000 | local_168[7] >> 0xb) ^
            (local_168[7] * 0x4000000 | local_168[7] >> 6));
    local_168[6] = uVar8 + iVar7;
    local_168[2] = iVar7 + ((local_168[3] | uVar5) & uVar11 | local_168[3] & uVar5) +
                           ((local_168[3] * 0x400 | local_168[3] >> 0x16) ^
                           (local_168[3] * 0x80000 | local_168[3] >> 0xd) ^
                           (local_168[3] * 0x40000000 | local_168[3] >> 2));
    iVar7 = uVar4 + K[uVar15 + 6] + local_178[uVar15 + 0x16] +
            ((local_168[7] ^ uVar6) & local_168[6] ^ uVar6) +
            ((local_168[6] * 0x80 | local_168[6] >> 0x19) ^
            (local_168[6] * 0x200000 | local_168[6] >> 0xb) ^
            (local_168[6] * 0x4000000 | local_168[6] >> 6));
    local_168[5] = uVar11 + iVar7;
    local_168[1] = iVar7 + ((local_168[2] | local_168[3]) & uVar5 | local_168[2] & local_168[3]) +
                           ((local_168[2] * 0x400 | local_168[2] >> 0x16) ^
                           (local_168[2] * 0x80000 | local_168[2] >> 0xd) ^
                           (local_168[2] * 0x40000000 | local_168[2] >> 2));
    iVar7 = uVar6 + K[uVar15 + 7] + local_178[uVar15 + 0x17] +
            ((local_168[6] ^ local_168[7]) & local_168[5] ^ local_168[7]) +
            ((local_168[5] * 0x80 | local_168[5] >> 0x19) ^
            (local_168[5] * 0x200000 | local_168[5] >> 0xb) ^
            (local_168[5] * 0x4000000 | local_168[5] >> 6));
    local_168[4] = uVar5 + iVar7;
    local_168[0] = iVar7 + ((local_168[1] | local_168[2]) & local_168[3] |
                           local_168[1] & local_168[2]) +
                           ((local_168[1] * 0x400 | local_168[1] >> 0x16) ^
                           (local_168[1] * 0x80000 | local_168[1] >> 0xd) ^
                           (local_168[1] * 0x40000000 | local_168[1] >> 2));
  }
  for (uVar15 = 0x10; uVar15 < 0x40; uVar15 = uVar15 + 8) {
    uVar1 = local_178[uVar15 + 0xe];
    uVar3 = local_178[uVar15 + 1];
    uVar4 = local_178[uVar15 + 2];
    uVar17 = (uVar1 >> 10 ^ (uVar1 << 0xd | uVar1 >> 0x13) ^ (uVar1 << 0xf | uVar1 >> 0x11)) +
             local_178[uVar15 + 9] + local_178[uVar15] +
             (uVar3 >> 3 ^ (uVar3 << 0xe | uVar3 >> 0x12) ^ (uVar3 << 0x19 | uVar3 >> 7));
    uVar19 = K[uVar15];
    local_178[uVar15 + 0x10] = uVar17;
    iVar7 = ((local_168[4] << 7 | local_168[4] >> 0x19) ^
            (local_168[4] << 0x15 | local_168[4] >> 0xb) ^
            (local_168[4] << 0x1a | local_168[4] >> 6)) + local_168[7] + uVar19 +
            ((local_168[5] ^ local_168[6]) & local_168[4] ^ local_168[6]) + uVar17;
    uVar5 = local_168[3] + iVar7;
    uVar14 = ((local_168[1] | local_168[0]) & local_168[2] | local_168[1] & local_168[0]) +
             ((local_168[0] << 10 | local_168[0] >> 0x16) ^
             (local_168[0] << 0x13 | local_168[0] >> 0xd) ^
             (local_168[0] << 0x1e | local_168[0] >> 2)) + iVar7;
    uVar1 = local_178[uVar15 + 0xf];
    uVar11 = uVar3 + local_178[uVar15 + 10] +
             (uVar1 >> 10 ^ (uVar1 << 0xd | uVar1 >> 0x13) ^ (uVar1 << 0xf | uVar1 >> 0x11)) +
             (uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7));
    uVar19 = K[uVar15 + 1];
    local_178[uVar15 + 0x11] = uVar11;
    iVar7 = ((uVar5 * 0x80 | uVar5 >> 0x19) ^
            (uVar5 * 0x200000 | uVar5 >> 0xb) ^ (uVar5 * 0x4000000 | uVar5 >> 6)) + uVar11 +
            ((local_168[5] ^ local_168[4]) & uVar5 ^ local_168[5]) + local_168[6] + uVar19;
    uVar6 = local_168[2] + iVar7;
    uVar9 = ((uVar14 | local_168[0]) & local_168[1] | uVar14 & local_168[0]) +
            ((uVar14 * 0x400 | uVar14 >> 0x16) ^
            (uVar14 * 0x80000 | uVar14 >> 0xd) ^ (uVar14 * 0x40000000 | uVar14 >> 2)) + iVar7;
    uVar1 = local_178[uVar15 + 3];
    uVar4 = (uVar17 >> 10 ^ (uVar17 * 0x2000 | uVar17 >> 0x13) ^ (uVar17 * 0x8000 | uVar17 >> 0x11))
            + uVar4 + local_178[uVar15 + 0xb] +
            (uVar1 >> 3 ^ (uVar1 << 0xe | uVar1 >> 0x12) ^ (uVar1 << 0x19 | uVar1 >> 7));
    uVar19 = K[uVar15 + 2];
    local_178[uVar15 + 0x12] = uVar4;
    iVar7 = local_168[5] + uVar19 + ((uVar5 ^ local_168[4]) & uVar6 ^ local_168[4]) + uVar4 +
            ((uVar6 * 0x80 | uVar6 >> 0x19) ^
            (uVar6 * 0x200000 | uVar6 >> 0xb) ^ (uVar6 * 0x4000000 | uVar6 >> 6));
    uVar8 = local_168[1] + iVar7;
    uVar12 = ((uVar9 | uVar14) & local_168[0] | uVar9 & uVar14) +
             ((uVar9 * 0x400 | uVar9 >> 0x16) ^
             (uVar9 * 0x80000 | uVar9 >> 0xd) ^ (uVar9 * 0x40000000 | uVar9 >> 2)) + iVar7;
    uVar3 = local_178[uVar15 + 4];
    uVar11 = (uVar11 >> 10 ^ (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11)
             ) + uVar1 + local_178[uVar15 + 0xc] +
             (uVar3 >> 3 ^ (uVar3 << 0xe | uVar3 >> 0x12) ^ (uVar3 << 0x19 | uVar3 >> 7));
    local_178[uVar15 + 0x13] = uVar11;
    iVar7 = local_168[4] + K[uVar15 + 3] + uVar11 + ((uVar6 ^ uVar5) & uVar8 ^ uVar5) +
            ((uVar8 * 0x80 | uVar8 >> 0x19) ^
            (uVar8 * 0x200000 | uVar8 >> 0xb) ^ (uVar8 * 0x4000000 | uVar8 >> 6));
    uVar13 = local_168[0] + iVar7;
    uVar16 = ((uVar12 | uVar9) & uVar14 | uVar12 & uVar9) +
             ((uVar12 * 0x400 | uVar12 >> 0x16) ^
             (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar7;
    uVar1 = local_178[uVar15 + 5];
    uVar18 = (uVar4 >> 10 ^ (uVar4 * 0x2000 | uVar4 >> 0x13) ^ (uVar4 * 0x8000 | uVar4 >> 0x11)) +
             uVar3 + local_178[uVar15 + 0xd] +
             (uVar1 >> 3 ^ (uVar1 << 0xe | uVar1 >> 0x12) ^ (uVar1 << 0x19 | uVar1 >> 7));
    local_178[uVar15 + 0x14] = uVar18;
    iVar7 = uVar5 + K[uVar15 + 4] + uVar18 + ((uVar8 ^ uVar6) & uVar13 ^ uVar6) +
            ((uVar13 * 0x80 | uVar13 >> 0x19) ^
            (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6));
    local_168[7] = uVar14 + iVar7;
    local_168[3] = iVar7 + ((uVar16 | uVar12) & uVar9 | uVar16 & uVar12) +
                           ((uVar16 * 0x400 | uVar16 >> 0x16) ^
                           (uVar16 * 0x80000 | uVar16 >> 0xd) ^ (uVar16 * 0x40000000 | uVar16 >> 2))
    ;
    uVar3 = local_178[uVar15 + 6];
    uVar4 = local_178[uVar15 + 7];
    uVar5 = (uVar11 >> 10 ^ (uVar11 * 0x2000 | uVar11 >> 0x13) ^ (uVar11 * 0x8000 | uVar11 >> 0x11))
            + uVar1 + local_178[uVar15 + 0xe] +
            (uVar3 >> 3 ^ (uVar3 << 0xe | uVar3 >> 0x12) ^ (uVar3 << 0x19 | uVar3 >> 7));
    iVar7 = uVar6 + K[uVar15 + 5] + uVar5 + ((uVar13 ^ uVar8) & local_168[7] ^ uVar8) +
            ((local_168[7] * 0x80 | local_168[7] >> 0x19) ^
            (local_168[7] * 0x200000 | local_168[7] >> 0xb) ^
            (local_168[7] * 0x4000000 | local_168[7] >> 6));
    local_168[6] = uVar9 + iVar7;
    local_168[2] = iVar7 + ((local_168[3] | uVar16) & uVar12 | local_168[3] & uVar16) +
                           ((local_168[3] * 0x400 | local_168[3] >> 0x16) ^
                           (local_168[3] * 0x80000 | local_168[3] >> 0xd) ^
                           (local_168[3] * 0x40000000 | local_168[3] >> 2));
    local_178[uVar15 + 0x15] = uVar5;
    uVar19 = (uVar18 >> 10 ^ (uVar18 * 0x2000 | uVar18 >> 0x13) ^ (uVar18 * 0x8000 | uVar18 >> 0x11)
             ) + uVar3 + local_178[uVar15 + 0xf] +
             (uVar4 >> 3 ^ (uVar4 << 0xe | uVar4 >> 0x12) ^ (uVar4 << 0x19 | uVar4 >> 7));
    local_178[uVar15 + 0x16] = uVar19;
    iVar7 = uVar8 + K[uVar15 + 6] + uVar19 + ((local_168[7] ^ uVar13) & local_168[6] ^ uVar13) +
            ((local_168[6] * 0x80 | local_168[6] >> 0x19) ^
            (local_168[6] * 0x200000 | local_168[6] >> 0xb) ^
            (local_168[6] * 0x4000000 | local_168[6] >> 6));
    local_168[5] = uVar12 + iVar7;
    local_168[1] = iVar7 + ((local_168[2] | local_168[3]) & uVar16 | local_168[2] & local_168[3]) +
                           ((local_168[2] * 0x400 | local_168[2] >> 0x16) ^
                           (local_168[2] * 0x80000 | local_168[2] >> 0xd) ^
                           (local_168[2] * 0x40000000 | local_168[2] >> 2));
    uVar1 = local_178[uVar15 + 8];
    uVar19 = uVar17 + uVar4 +
             (uVar1 >> 3 ^ (uVar1 << 0xe | uVar1 >> 0x12) ^ (uVar1 << 0x19 | uVar1 >> 7)) +
             (uVar5 >> 10 ^ (uVar5 * 0x2000 | uVar5 >> 0x13) ^ (uVar5 * 0x8000 | uVar5 >> 0x11));
    local_178[uVar15 + 0x17] = uVar19;
    iVar7 = uVar13 + K[uVar15 + 7] + uVar19 +
            ((local_168[6] ^ local_168[7]) & local_168[5] ^ local_168[7]) +
            ((local_168[5] * 0x80 | local_168[5] >> 0x19) ^
            (local_168[5] * 0x200000 | local_168[5] >> 0xb) ^
            (local_168[5] * 0x4000000 | local_168[5] >> 6));
    local_168[4] = uVar16 + iVar7;
    local_168[0] = iVar7 + ((local_168[1] | local_168[2]) & local_168[3] |
                           local_168[1] & local_168[2]) +
                           ((local_168[1] * 0x400 | local_168[1] >> 0x16) ^
                           (local_168[1] * 0x80000 | local_168[1] >> 0xd) ^
                           (local_168[1] * 0x40000000 | local_168[1] >> 2));
  }
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    ctx->state[lVar2] = ctx->state[lVar2] + local_178[lVar2 + 4];
  }
  return 0;
}

Assistant:

int mbedtls_internal_sha256_process( mbedtls_sha256_context *ctx,
                                const unsigned char data[64] )
{
    uint32_t temp1, temp2, W[64];
    uint32_t A[8];
    unsigned int i;

    SHA256_VALIDATE_RET( ctx != NULL );
    SHA256_VALIDATE_RET( (const unsigned char *)data != NULL );

    for( i = 0; i < 8; i++ )
        A[i] = ctx->state[i];

#if defined(MBEDTLS_SHA256_SMALLER)
    for( i = 0; i < 64; i++ )
    {
        if( i < 16 )
            GET_UINT32_BE( W[i], data, 4 * i );
        else
            R( i );

        P( A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i], K[i] );

        temp1 = A[7]; A[7] = A[6]; A[6] = A[5]; A[5] = A[4]; A[4] = A[3];
        A[3] = A[2]; A[2] = A[1]; A[1] = A[0]; A[0] = temp1;
    }
#else /* MBEDTLS_SHA256_SMALLER */
    for( i = 0; i < 16; i++ )
        GET_UINT32_BE( W[i], data, 4 * i );

    for( i = 0; i < 16; i += 8 )
    {
        P( A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], W[i+0], K[i+0] );
        P( A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], W[i+1], K[i+1] );
        P( A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], W[i+2], K[i+2] );
        P( A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], W[i+3], K[i+3] );
        P( A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], W[i+4], K[i+4] );
        P( A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], W[i+5], K[i+5] );
        P( A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], W[i+6], K[i+6] );
        P( A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], W[i+7], K[i+7] );
    }

    for( i = 16; i < 64; i += 8 )
    {
        P( A[0], A[1], A[2], A[3], A[4], A[5], A[6], A[7], R(i+0), K[i+0] );
        P( A[7], A[0], A[1], A[2], A[3], A[4], A[5], A[6], R(i+1), K[i+1] );
        P( A[6], A[7], A[0], A[1], A[2], A[3], A[4], A[5], R(i+2), K[i+2] );
        P( A[5], A[6], A[7], A[0], A[1], A[2], A[3], A[4], R(i+3), K[i+3] );
        P( A[4], A[5], A[6], A[7], A[0], A[1], A[2], A[3], R(i+4), K[i+4] );
        P( A[3], A[4], A[5], A[6], A[7], A[0], A[1], A[2], R(i+5), K[i+5] );
        P( A[2], A[3], A[4], A[5], A[6], A[7], A[0], A[1], R(i+6), K[i+6] );
        P( A[1], A[2], A[3], A[4], A[5], A[6], A[7], A[0], R(i+7), K[i+7] );
    }
#endif /* MBEDTLS_SHA256_SMALLER */

    for( i = 0; i < 8; i++ )
        ctx->state[i] += A[i];

    return( 0 );
}